

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toolutil.cpp
# Opt level: O1

char * findDirname(char *path,char *buffer,int32_t bufLen,UErrorCode *status)

{
  char *pcVar1;
  uint uVar2;
  uint uVar3;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    pcVar1 = strrchr(path,0x2f);
    uVar3 = (int)pcVar1 - (int)path;
    uVar2 = 1;
    if (1 < (int)uVar3) {
      uVar2 = uVar3;
    }
    if (pcVar1 == (char *)0x0) {
      uVar2 = 0;
    }
    if ((int)uVar2 < bufLen) {
      if (pcVar1 == (char *)0x0) {
        path = "";
      }
      strncpy(buffer,path,(ulong)uVar2);
      buffer[uVar2] = '\0';
      return buffer;
    }
    *status = U_BUFFER_OVERFLOW_ERROR;
  }
  return (char *)0x0;
}

Assistant:

U_CAPI const char * U_EXPORT2
findDirname(const char *path, char *buffer, int32_t bufLen, UErrorCode* status) {
  if(U_FAILURE(*status)) return NULL;
  const char *resultPtr = NULL;
  int32_t resultLen = 0;

  const char *basename=uprv_strrchr(path, U_FILE_SEP_CHAR);
#if U_FILE_ALT_SEP_CHAR!=U_FILE_SEP_CHAR
  const char *basenameAlt=uprv_strrchr(path, U_FILE_ALT_SEP_CHAR);
  if(basenameAlt && (!basename || basename<basenameAlt)) {
    basename = basenameAlt;
  }
#endif
  if(!basename) {
    /* no basename - return ''. */
    resultPtr = "";
    resultLen = 0;
  } else {
    resultPtr = path;
    resultLen = basename - path;
    if(resultLen<1) {
      resultLen = 1; /* '/' or '/a' -> '/' */
    }
  }

  if((resultLen+1) <= bufLen) {
    uprv_strncpy(buffer, resultPtr, resultLen);
    buffer[resultLen]=0;
    return buffer;
  } else {
    *status = U_BUFFER_OVERFLOW_ERROR;
    return NULL;
  }
}